

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::FixupOutPolygon(Clipper *this,OutRec *outRec)

{
  OutPt *pOVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  OutPt *pOVar5;
  OutPt **ppOVar6;
  OutPt *tmpPp;
  OutPt *pOVar7;
  OutPt *pOVar8;
  OutPt *tmp;
  OutPt *pp;
  IntPoint pt3;
  IntPoint pt2;
  
  pOVar7 = outRec->bottomPt;
  outRec->pts = pOVar7;
  pOVar5 = pOVar7->prev;
  if (pOVar5 != pOVar7) {
    pOVar8 = (OutPt *)0x0;
    pp = pOVar7;
    do {
      ppOVar6 = &pp->prev;
      pOVar1 = pp->next;
      pOVar7 = pp;
      if (pOVar5 == pOVar1) break;
      lVar2 = (pp->pt).X;
      lVar3 = (pOVar1->pt).X;
      if (((lVar2 == lVar3) && ((pp->pt).Y == (pOVar1->pt).Y)) ||
         (pt3.Y = (pOVar1->pt).Y, pt3.X = lVar3, pt2.Y = (pp->pt).Y, pt2.X = lVar2,
         bVar4 = SlopesEqual(pOVar5->pt,pt2,pt3,
                             (bool)(this->_vptr_Clipper[-3] + 0x10)
                                   [(long)&(this->m_PolyOuts).
                                           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                   ]), bVar4)) {
        if (pp == outRec->bottomPt) {
          outRec->bottomPt = (OutPt *)0x0;
        }
        (*ppOVar6)->next = pp->next;
        pp->next->prev = *ppOVar6;
        pOVar7 = *ppOVar6;
        if (pp != (OutPt *)0x0) {
          operator_delete(pp);
        }
        pOVar8 = (OutPt *)0x0;
      }
      else {
        if (pp == pOVar8) {
          if (outRec->bottomPt != (OutPt *)0x0) {
            return;
          }
          pOVar5 = GetBottomPt(pp);
          outRec->bottomPt = pOVar5;
          pOVar5->idx = outRec->idx;
          outRec->pts = outRec->bottomPt;
          return;
        }
        if (pOVar8 == (OutPt *)0x0) {
          pOVar8 = pp;
        }
        pOVar7 = pp->next;
      }
      pOVar5 = pOVar7->prev;
      pp = pOVar7;
    } while (pOVar5 != pOVar7);
  }
  if (pOVar7 != (OutPt *)0x0) {
    pOVar5->next = (OutPt *)0x0;
    do {
      pOVar5 = pOVar7->next;
      operator_delete(pOVar7);
      pOVar7 = pOVar5;
    } while (pOVar5 != (OutPt *)0x0);
  }
  outRec->pts = (OutPt *)0x0;
  outRec->bottomPt = (OutPt *)0x0;
  return;
}

Assistant:

void Clipper::FixupOutPolygon(OutRec &outRec)
{
  //FixupOutPolygon() - removes duplicate points and simplifies consecutive
  //parallel edges by removing the middle vertex.
  OutPt *lastOK = 0;
  outRec.pts = outRec.bottomPt;
  OutPt *pp = outRec.bottomPt;

  for (;;)
  {
    if (pp->prev == pp || pp->prev == pp->next )
    {
      DisposeOutPts(pp);
      outRec.pts = 0;
      outRec.bottomPt = 0;
      return;
    }
    //test for duplicate points and for same slope (cross-product) ...
    if ( PointsEqual(pp->pt, pp->next->pt) ||
      SlopesEqual(pp->prev->pt, pp->pt, pp->next->pt, m_UseFullRange) )
    {
      lastOK = 0;
      OutPt *tmp = pp;
      if (pp == outRec.bottomPt)
        outRec.bottomPt = 0; //flags need for updating
      pp->prev->next = pp->next;
      pp->next->prev = pp->prev;
      pp = pp->prev;
      delete tmp;
    }
    else if (pp == lastOK) break;
    else
    {
      if (!lastOK) lastOK = pp;
      pp = pp->next;
    }
  }
  if (!outRec.bottomPt) {
    outRec.bottomPt = GetBottomPt(pp);
    outRec.bottomPt->idx = outRec.idx;
    outRec.pts = outRec.bottomPt;
  }
}